

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.hpp
# Opt level: O2

void __thiscall OpenMD::ForceField::~ForceField(ForceField *this)

{
  this->_vptr_ForceField = (_func_int **)&PTR__ForceField_002051e8;
  std::__cxx11::string::~string((string *)&this->forceFieldFileName_);
  std::__cxx11::string::~string((string *)&this->wildCardAtomTypeName_);
  std::__cxx11::string::~string((string *)&this->ffPath_);
  SectionParserManager::~SectionParserManager(&this->spMan_);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->atypeIdentToName)._M_t);
  ForceFieldOptions::~ForceFieldOptions(&this->forceFieldOptions_);
  TypeContainer<OpenMD::NonBondedInteractionType,_2>::~TypeContainer
            (&this->nonBondedInteractionTypeCont_);
  TypeContainer<OpenMD::InversionType,_4>::~TypeContainer(&this->inversionTypeCont_);
  TypeContainer<OpenMD::TorsionType,_4>::~TypeContainer(&this->torsionTypeCont_);
  TypeContainer<OpenMD::BendType,_3>::~TypeContainer(&this->bendTypeCont_);
  TypeContainer<OpenMD::BondType,_2>::~TypeContainer(&this->bondTypeCont_);
  TypeContainer<OpenMD::AtomType,_1>::~TypeContainer(&this->atomTypeCont_);
  return;
}

Assistant:

virtual ~ForceField() = default;